

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O0

string * __thiscall dd::Location::ToString_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  allocator<char> local_199;
  char acStack_198 [8];
  char buf [256];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_50;
  int i;
  allocator<char> local_39;
  string local_38 [8];
  string file_name;
  Location *this_local;
  
  pcVar1 = this->_file_name;
  file_name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_50 = std::__cxx11::string::length();
  do {
    local_50 = local_50 + -1;
    if (local_50 < 0) goto LAB_001750b2;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)local_38);
    bVar2 = std::operator==(&local_70,"/");
    std::__cxx11::string::~string((string *)&local_70);
  } while (!bVar2);
  std::__cxx11::string::substr((ulong)local_90,(ulong)local_38);
  std::__cxx11::string::operator=(local_38,local_90);
  std::__cxx11::string::~string(local_90);
LAB_001750b2:
  uVar4 = 0;
  uVar5 = 0;
  buf[0xe8] = '\0';
  buf[0xe9] = '\0';
  buf[0xea] = '\0';
  buf[0xeb] = '\0';
  buf[0xec] = '\0';
  buf[0xed] = '\0';
  buf[0xee] = '\0';
  buf[0xef] = '\0';
  buf[0xf0] = '\0';
  buf[0xf1] = '\0';
  buf[0xf2] = '\0';
  buf[0xf3] = '\0';
  buf[0xf4] = '\0';
  buf[0xf5] = '\0';
  buf[0xf6] = '\0';
  buf[0xf7] = '\0';
  buf[0xd8] = '\0';
  buf[0xd9] = '\0';
  buf[0xda] = '\0';
  buf[0xdb] = '\0';
  buf[0xdc] = '\0';
  buf[0xdd] = '\0';
  buf[0xde] = '\0';
  buf[0xdf] = '\0';
  buf[0xe0] = '\0';
  buf[0xe1] = '\0';
  buf[0xe2] = '\0';
  buf[0xe3] = '\0';
  buf[0xe4] = '\0';
  buf[0xe5] = '\0';
  buf[0xe6] = '\0';
  buf[0xe7] = '\0';
  buf[200] = '\0';
  buf[0xc9] = '\0';
  buf[0xca] = '\0';
  buf[0xcb] = '\0';
  buf[0xcc] = '\0';
  buf[0xcd] = '\0';
  buf[0xce] = '\0';
  buf[0xcf] = '\0';
  buf[0xd0] = '\0';
  buf[0xd1] = '\0';
  buf[0xd2] = '\0';
  buf[0xd3] = '\0';
  buf[0xd4] = '\0';
  buf[0xd5] = '\0';
  buf[0xd6] = '\0';
  buf[0xd7] = '\0';
  buf[0xb8] = '\0';
  buf[0xb9] = '\0';
  buf[0xba] = '\0';
  buf[0xbb] = '\0';
  buf[0xbc] = '\0';
  buf[0xbd] = '\0';
  buf[0xbe] = '\0';
  buf[0xbf] = '\0';
  buf[0xc0] = '\0';
  buf[0xc1] = '\0';
  buf[0xc2] = '\0';
  buf[0xc3] = '\0';
  buf[0xc4] = '\0';
  buf[0xc5] = '\0';
  buf[0xc6] = '\0';
  buf[199] = '\0';
  buf[0xa8] = '\0';
  buf[0xa9] = '\0';
  buf[0xaa] = '\0';
  buf[0xab] = '\0';
  buf[0xac] = '\0';
  buf[0xad] = '\0';
  buf[0xae] = '\0';
  buf[0xaf] = '\0';
  buf[0xb0] = '\0';
  buf[0xb1] = '\0';
  buf[0xb2] = '\0';
  buf[0xb3] = '\0';
  buf[0xb4] = '\0';
  buf[0xb5] = '\0';
  buf[0xb6] = '\0';
  buf[0xb7] = '\0';
  buf[0x98] = '\0';
  buf[0x99] = '\0';
  buf[0x9a] = '\0';
  buf[0x9b] = '\0';
  buf[0x9c] = '\0';
  buf[0x9d] = '\0';
  buf[0x9e] = '\0';
  buf[0x9f] = '\0';
  buf[0xa0] = '\0';
  buf[0xa1] = '\0';
  buf[0xa2] = '\0';
  buf[0xa3] = '\0';
  buf[0xa4] = '\0';
  buf[0xa5] = '\0';
  buf[0xa6] = '\0';
  buf[0xa7] = '\0';
  buf[0x88] = '\0';
  buf[0x89] = '\0';
  buf[0x8a] = '\0';
  buf[0x8b] = '\0';
  buf[0x8c] = '\0';
  buf[0x8d] = '\0';
  buf[0x8e] = '\0';
  buf[0x8f] = '\0';
  buf[0x90] = '\0';
  buf[0x91] = '\0';
  buf[0x92] = '\0';
  buf[0x93] = '\0';
  buf[0x94] = '\0';
  buf[0x95] = '\0';
  buf[0x96] = '\0';
  buf[0x97] = '\0';
  buf[0x78] = '\0';
  buf[0x79] = '\0';
  buf[0x7a] = '\0';
  buf[0x7b] = '\0';
  buf[0x7c] = '\0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  buf[0x80] = '\0';
  buf[0x81] = '\0';
  buf[0x82] = '\0';
  buf[0x83] = '\0';
  buf[0x84] = '\0';
  buf[0x85] = '\0';
  buf[0x86] = '\0';
  buf[0x87] = '\0';
  buf[0x68] = '\0';
  buf[0x69] = '\0';
  buf[0x6a] = '\0';
  buf[0x6b] = '\0';
  buf[0x6c] = '\0';
  buf[0x6d] = '\0';
  buf[0x6e] = '\0';
  buf[0x6f] = '\0';
  buf[0x70] = '\0';
  buf[0x71] = '\0';
  buf[0x72] = '\0';
  buf[0x73] = '\0';
  buf[0x74] = '\0';
  buf[0x75] = '\0';
  buf[0x76] = '\0';
  buf[0x77] = '\0';
  buf[0x58] = '\0';
  buf[0x59] = '\0';
  buf[0x5a] = '\0';
  buf[0x5b] = '\0';
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  buf[0x60] = '\0';
  buf[0x61] = '\0';
  buf[0x62] = '\0';
  buf[99] = '\0';
  buf[100] = '\0';
  buf[0x65] = '\0';
  buf[0x66] = '\0';
  buf[0x67] = '\0';
  buf[0x48] = '\0';
  buf[0x49] = '\0';
  buf[0x4a] = '\0';
  buf[0x4b] = '\0';
  buf[0x4c] = '\0';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  buf[0x50] = '\0';
  buf[0x51] = '\0';
  buf[0x52] = '\0';
  buf[0x53] = '\0';
  buf[0x54] = '\0';
  buf[0x55] = '\0';
  buf[0x56] = '\0';
  buf[0x57] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x40] = '\0';
  buf[0x41] = '\0';
  buf[0x42] = '\0';
  buf[0x43] = '\0';
  buf[0x44] = '\0';
  buf[0x45] = '\0';
  buf[0x46] = '\0';
  buf[0x47] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  acStack_198[0] = '\0';
  acStack_198[1] = '\0';
  acStack_198[2] = '\0';
  acStack_198[3] = '\0';
  acStack_198[4] = '\0';
  acStack_198[5] = '\0';
  acStack_198[6] = '\0';
  acStack_198[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  pcVar1 = this->_function_name;
  uVar3 = std::__cxx11::string::c_str();
  snprintf(acStack_198,0x100,"%s@%s:%d",pcVar1,uVar3,(ulong)(uint)this->_line_number,uVar4,uVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,acStack_198,&local_199);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString()const {
			std::string file_name = _file_name;
			for (int i = file_name.length() - 1; i >= 0; i--)
			{
#ifdef WIN32
				if (file_name.substr(i, 1) == "\\")
#else
				if (file_name.substr(i, 1) == "/")
#endif
				{
					file_name = file_name.substr(i + 1);
					break;
				}
			}

			char buf[256] = { 0 };
			snprintf(buf, sizeof(buf), "%s@%s:%d", _function_name, file_name.c_str(), _line_number);
			return buf;
		}